

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-history.c
# Opt level: O0

_Bool history_add_full(player *p,bitflag *type,wchar_t aidx,wchar_t place,wchar_t clev,
                      wchar_t turnno,char *text)

{
  player_history *h_00;
  player_history *h;
  wchar_t turnno_local;
  wchar_t clev_local;
  wchar_t place_local;
  wchar_t aidx_local;
  bitflag *type_local;
  player *p_local;
  
  h_00 = &p->hist;
  if (h_00->entries == (history_info *)0x0) {
    history_init(h_00);
  }
  else if ((p->hist).next == (p->hist).length) {
    history_realloc(h_00);
  }
  flag_copy(h_00->entries[(p->hist).next].type,type,2);
  h_00->entries[(p->hist).next].place = (int16_t)place;
  h_00->entries[(p->hist).next].clev = (int16_t)clev;
  h_00->entries[(p->hist).next].a_idx = (uint8_t)aidx;
  h_00->entries[(p->hist).next].turn = turnno;
  my_strcpy(h_00->entries[(p->hist).next].event,text,0x50);
  (p->hist).next = (p->hist).next + 1;
  return true;
}

Assistant:

bool history_add_full(struct player *p,
		bitflag *type,
		int aidx,
		int place,
		int clev,
		int turnno,
		const char *text)
{
	struct player_history *h = &p->hist;

	/* Allocate or expand the history list if needed */
	if (!h->entries)
		history_init(h);
	else if (h->next == h->length)
		history_realloc(h);

	/* Add entry */
	hist_copy(h->entries[h->next].type, type);
	h->entries[h->next].place = place;
	h->entries[h->next].clev = clev;
	h->entries[h->next].a_idx = aidx;
	h->entries[h->next].turn = turnno;
	my_strcpy(h->entries[h->next].event,
			text,
			sizeof(h->entries[h->next].event));

	h->next++;

	return true;
}